

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O2

bool __thiscall
Lambertian::Scatter(Lambertian *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                   Ray *ray_out)

{
  Vec3 *v1;
  float fVar1;
  Texture *pTVar2;
  float fVar3;
  float fVar4;
  Vec3 _target;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  
  v1 = &hit_record->m_point;
  operator+(v1,&hit_record->m_normal);
  random_in_unit_disk();
  operator+(&local_54,&local_48);
  operator-(&local_3c,v1);
  fVar1 = ray_in->m_time;
  fVar3 = (hit_record->m_point).e[1];
  fVar4 = (hit_record->m_point).e[2];
  (ray_out->m_origin).e[0] = (hit_record->m_point).e[0];
  (ray_out->m_origin).e[1] = fVar3;
  (ray_out->m_origin).e[2] = fVar4;
  (ray_out->m_direction).e[0] = local_54.e[0];
  *(ulong *)((ray_out->m_direction).e + 1) = CONCAT44(local_54.e[2],local_54.e[1]);
  ray_out->m_time = fVar1;
  pTVar2 = (this->super_Material).m_albedo;
  (*pTVar2->_vptr_Texture[2])((ulong)(uint)hit_record->m_u,hit_record->m_v,&local_54,pTVar2,v1);
  attenuation->e[2] = local_54.e[2];
  *(ulong *)attenuation->e = CONCAT44(local_54.e[1],local_54.e[0]);
  return true;
}

Assistant:

bool
Lambertian::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _target = hit_record.m_point + hit_record.m_normal + random_in_unit_disk();

    ray_out      = Ray(hit_record.m_point, _target - hit_record.m_point, ray_in.GetTime());
    attenuation  = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);;

    return true;
}